

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O0

TCHAR * __thiscall CASC_CSV::GetString(CASC_CSV *this,size_t Index)

{
  size_t cchLength;
  size_t nLength;
  TCHAR *szString;
  size_t Index_local;
  CASC_CSV *this_local;
  
  if (Index < this->nColumns) {
    cchLength = this->Columns[Index].nLength;
    this_local = (CASC_CSV *)malloc(cchLength + 2);
    if (this_local != (CASC_CSV *)0x0) {
      CopyString((char *)this_local,this->Columns[Index].szString,cchLength);
      *(char *)((long)&this_local->Headers[0].szString + cchLength + 1) = '\0';
    }
  }
  else {
    this_local = (CASC_CSV *)0x0;
  }
  return (TCHAR *)this_local;
}

Assistant:

TCHAR * CASC_CSV::GetString(size_t Index)
{
    TCHAR * szString;
    size_t nLength;

    // Check for index overflow
    if (Index >= nColumns)
        return NULL;
    nLength = Columns[Index].nLength;

    // Allocate buffer for string. Make it double-zero-terminated
    // in order to be multi-SZ as well
    szString = CASC_ALLOC(TCHAR, nLength + 2);
    if (szString != NULL)
    {
        CopyString(szString, Columns[Index].szString, nLength);
        szString[nLength + 1] = 0;
    }

    return szString;
}